

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::codepointList(GrpParser *this)

{
  ASTFactory *this_00;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST *this_01;
  RefAST *pRVar5;
  RefAST tmp137_AST;
  RefAST codepointList_AST;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefAST tmp135_AST;
  ASTPair currentAST;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  this_01 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_01,&nullAST);
  codepointList_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar1 = nullAST;
  if (iVar3 == 6) {
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp135_AST = RVar1;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
    this_00 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp137_AST,(RefToken *)this_00);
    RefCount<AST>::operator=(&tmp135_AST,&tmp137_AST);
    RefCount<AST>::~RefCount(&tmp137_AST);
    RefCount<Token>::~RefCount(&local_88);
    Parser::match((Parser *)this,6);
    codepointItem(this);
    local_38.ref = this_01->ref;
    if (local_38.ref != (Ref *)0x0) {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    ASTFactory::addASTChild(this_00,&currentAST,&local_38);
    pRVar5 = &local_38;
    while( true ) {
      RefCount<AST>::~RefCount(pRVar5);
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar2 = BitSet::member(&_tokenSet_36,iVar3);
      RVar1 = nullAST;
      if (!bVar2) break;
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      RVar1 = nullAST;
      if ((iVar3 != 0x11) && (iVar3 != 0x14)) {
        if (iVar3 == 0x15) {
          if (nullAST.ref != (Ref *)0x0) {
            (nullAST.ref)->count = (nullAST.ref)->count + 1;
          }
          tmp137_AST = RVar1;
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
          ASTFactory::create((ASTFactory *)&stack0xffffffffffffff58,(RefToken *)this_00);
          RefCount<AST>::operator=(&tmp137_AST,(RefCount<AST> *)&stack0xffffffffffffff58);
          RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff58);
          RefCount<Token>::~RefCount(&local_40);
          Parser::match((Parser *)this,0x15);
          RefCount<AST>::~RefCount(&tmp137_AST);
        }
        else if (iVar3 != 0x21) {
          pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
          NoViableAltException::NoViableAltException(pNVar4,&local_48);
          __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
      }
      codepointItem(this);
      local_50.ref = this_01->ref;
      if (local_50.ref != (Ref *)0x0) {
        (local_50.ref)->count = (local_50.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&currentAST,&local_50);
      pRVar5 = &local_50;
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp137_AST = RVar1;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
    ASTFactory::create((ASTFactory *)&stack0xffffffffffffff58,(RefToken *)this_00);
    RefCount<AST>::operator=(&tmp137_AST,(RefCount<AST> *)&stack0xffffffffffffff58);
    RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff58);
    RefCount<Token>::~RefCount(&local_90);
    Parser::match((Parser *)this,7);
    RefCount<AST>::~RefCount(&tmp137_AST);
    pRVar5 = &tmp135_AST;
  }
  else {
    if (((iVar3 != 0x11) && (iVar3 != 0x14)) && (iVar3 != 0x21)) {
      pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
      NoViableAltException::NoViableAltException(pNVar4,&local_60);
      __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    codepointItem(this);
    local_58.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_58.ref != (Ref *)0x0) {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_58);
    pRVar5 = &local_58;
  }
  RefCount<AST>::~RefCount(pRVar5);
  RefCount<AST>::operator=(&codepointList_AST,&currentAST.root);
  RefCount<AST>::operator=(this_01,&codepointList_AST);
  RefCount<AST>::~RefCount(&codepointList_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::codepointList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST codepointList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case OP_LPAREN:
		{
			{
			RefAST tmp135_AST = nullAST;
			tmp135_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_36.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp136_AST = nullAST;
						tmp136_AST = astFactory.create(LT(1));
						match(OP_COMMA);
						break;
					}
					case LIT_INT:
					case LIT_STRING:
					case LIT_CHAR:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					codepointItem();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop101;
				}
				
			} while (true);
			_loop101:;
			}
			RefAST tmp137_AST = nullAST;
			tmp137_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		case LIT_INT:
		case LIT_STRING:
		case LIT_CHAR:
		{
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		codepointList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_37);
	}
	returnAST = codepointList_AST;
}